

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void Message::putMessage(Result code,size_t value)

{
  size_t a;
  mapped_type *s1;
  QLatin1Char local_4b;
  QChar local_4a;
  QString local_48;
  QString local_30;
  size_t local_18;
  size_t value_local;
  Result code_local;
  
  local_18 = value;
  value_local._4_4_ = code;
  s1 = std::
       map<Result,_QString,_std::less<Result>,_std::allocator<std::pair<const_Result,_QString>_>_>::
       at(&message,(key_type *)((long)&value_local + 4));
  operator+(&local_48,s1,"%1 \t\n\n");
  a = local_18;
  QLatin1Char::QLatin1Char(&local_4b,' ');
  QChar::QChar(&local_4a,local_4b);
  QString::arg(&local_30,&local_48,a,0,10,local_4a);
  std::queue<QString,_std::deque<QString,_std::allocator<QString>_>_>::push(&messageQueue,&local_30)
  ;
  QString::~QString(&local_30);
  QString::~QString(&local_48);
  return;
}

Assistant:

void Message::putMessage( Result code, size_t value )
{
    messageQueue.push( QString( message.at( code ) + "%1 \t\n\n" ).arg( value ));
}